

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O2

bool __thiscall
irr::scene::CXMeshFileLoader::parseDataObjectMeshVertexColors(CXMeshFileLoader *this,SXMesh *mesh)

{
  pointer pSVar1;
  bool bVar2;
  u32 uVar3;
  u32 uVar4;
  char *this_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  string<char> local_40;
  
  bVar2 = readHeadOfDataObject(this,(stringc *)0x0);
  if (bVar2) {
    mesh->HasVertexColors = true;
    uVar3 = readInt(this);
    while (bVar2 = uVar3 != 0, uVar3 = uVar3 - 1, bVar2) {
      uVar4 = readInt(this);
      pSVar1 = (mesh->Vertices).m_data.
               super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((uint)(((long)(mesh->Vertices).m_data.
                        super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x24) <= uVar4)
      {
        this_00 = "index value in parseDataObjectMeshVertexColors out of bounds";
        __x_03 = extraout_XMM0_Qa_00;
        goto LAB_001dec3d;
      }
      readRGBA(this,&pSVar1[uVar4].Color);
      checkForOneFollowingSemicolons(this);
    }
    bVar2 = checkForOneFollowingSemicolons(this);
    if (!bVar2) {
      os::Printer::log((Printer *)
                       "No finishing semicolon in Mesh Vertex Colors Array found in x file",__x);
      core::string<char>::string(&local_40,this->Line);
      os::Printer::log(__x_00);
      ::std::__cxx11::string::_M_dispose();
    }
    bVar2 = checkForClosingBrace(this);
    if (bVar2) {
      return true;
    }
    os::Printer::log((Printer *)"No closing brace in Mesh Texture Coordinates Array found in x file"
                     ,__x_01);
    core::string<char>::string(&local_40,this->Line);
    os::Printer::log(__x_02);
    ::std::__cxx11::string::_M_dispose();
  }
  else {
    this_00 = "No opening brace for Mesh Vertex Colors found in x file";
    __x_03 = extraout_XMM0_Qa;
LAB_001dec3d:
    os::Printer::log((Printer *)this_00,__x_03);
    core::string<char>::string(&local_40,this->Line);
    os::Printer::log(__x_04);
    ::std::__cxx11::string::_M_dispose();
    this->ErrorState = true;
  }
  return false;
}

Assistant:

bool CXMeshFileLoader::parseDataObjectMeshVertexColors(SXMesh &mesh)
{
#ifdef _XREADER_DEBUG
	os::Printer::log("CXFileReader: reading mesh vertex colors", ELL_DEBUG);
#endif

	if (!readHeadOfDataObject()) {
		os::Printer::log("No opening brace for Mesh Vertex Colors found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	mesh.HasVertexColors = true;
	const u32 nColors = readInt();
	for (u32 i = 0; i < nColors; ++i) {
		const u32 Index = readInt();
		if (Index >= mesh.Vertices.size()) {
			os::Printer::log("index value in parseDataObjectMeshVertexColors out of bounds", ELL_WARNING);
			os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			SET_ERR_AND_RETURN();
		}
		readRGBA(mesh.Vertices[Index].Color);
		checkForOneFollowingSemicolons();
	}

	if (!checkForOneFollowingSemicolons()) {
		os::Printer::log("No finishing semicolon in Mesh Vertex Colors Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
	}

	if (!checkForClosingBrace()) {
		os::Printer::log("No closing brace in Mesh Texture Coordinates Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		return false;
	}

	return true;
}